

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall
UniformData::parse(UniformData *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *_command,size_t _start,bool _queue)

{
  ulong uVar1;
  float *pfVar2;
  pointer pbVar3;
  long lVar4;
  size_t sVar5;
  float fVar6;
  UniformValue candidate;
  UniformValue local_40;
  
  pbVar3 = (_command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(_command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
  if ((_start < 5) && (_start < uVar1)) {
    lVar4 = _start << 5;
    pfVar2 = local_40._M_elems;
    sVar5 = _start;
    do {
      fVar6 = vera::toFloat((string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar4));
      *pfVar2 = fVar6;
      pbVar3 = (_command->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (long)(_command->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
      if (3 < sVar5) break;
      sVar5 = sVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar4 = lVar4 + 0x20;
    } while (sVar5 < uVar1);
  }
  set(this,&local_40,uVar1 - _start,false,_queue);
  return;
}

Assistant:

void UniformData::parse(const std::vector<std::string>& _command, size_t _start, bool _queue) {;
    UniformValue candidate;
    for (size_t i = _start; i < _command.size() && i < 5; i++) 
        candidate[i-_start] = vera::toFloat(_command[i]);

    set(candidate, _command.size() - _start, false, _queue);
}